

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

void __thiscall
dxil_spv::SPIRVModule::Impl::add_instrumented_instruction(Impl *this,Op op,Block *bb,Id id)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  Block *this_00;
  Op OVar1;
  int iVar2;
  Id IVar3;
  Id initializer;
  pointer pIVar4;
  uint u;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_d0;
  undefined4 local_c4;
  Op local_c0;
  Id local_bc;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_b8;
  __single_object call;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_98;
  Id local_80;
  Id local_7c;
  Id payload_block;
  Id payload_data_array;
  iterator local_70;
  undefined8 local_68;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_60;
  Id local_44;
  Id local_40;
  Id control_data;
  Id u32_array_type;
  Id uvec4_type;
  Id u32_type;
  Id type_id;
  Id *call_id;
  Block *pBStack_20;
  Id id_local;
  Block *bb_local;
  Impl *pIStack_10;
  Op op_local;
  Impl *this_local;
  
  if ((id != 0) && (((this->instruction_instrumentation).info.enabled & 1U) != 0)) {
    _u32_type = (Id *)0x0;
    uvec4_type = 0;
    call_id._4_4_ = id;
    pBStack_20 = bb;
    bb_local._4_4_ = op;
    pIStack_10 = this;
    if (op == OpAssumeTrueKHR) {
      _u32_type = &(this->instruction_instrumentation).assume_true_call_id;
    }
    else {
      uvec4_type = spv::Builder::getTypeId(&this->builder,id);
      OVar1 = spv::Builder::getTypeClass(&this->builder,uvec4_type);
      if (OVar1 != OpTypeFloat) {
        return;
      }
      iVar2 = spv::Builder::getScalarTypeWidth(&this->builder,uvec4_type);
      if (iVar2 == 0x10) {
        _u32_type = &(this->instruction_instrumentation).nan_inf_instrument_fp16_call_id;
      }
      else if (iVar2 == 0x20) {
        _u32_type = &(this->instruction_instrumentation).nan_inf_instrument_fp32_call_id;
      }
      else if (iVar2 == 0x40) {
        _u32_type = &(this->instruction_instrumentation).nan_inf_instrument_fp64_call_id;
      }
    }
    if ((this->instruction_instrumentation).should_report_instrumentation_id == 0) {
      IVar3 = spv::Builder::makeBoolType(&this->builder);
      initializer = spv::Builder::makeBoolConstant(&this->builder,true,false);
      IVar3 = create_variable_with_initializer
                        (this,StorageClassPrivate,IVar3,initializer,"ShouldReportInstrumentation");
      (this->instruction_instrumentation).should_report_instrumentation_id = IVar3;
      u32_array_type = spv::Builder::makeUintType(&this->builder,0x20);
      control_data = spv::Builder::makeVectorType(&this->builder,u32_array_type,4);
      local_40 = spv::Builder::makeRuntimeArray(&this->builder,u32_array_type);
      spv::Builder::addDecoration(&this->builder,local_40,DecorationArrayStride,4);
      payload_data_array = local_40;
      local_70 = &payload_data_array;
      local_68 = 1;
      __l_00._M_len = 1;
      __l_00._M_array = local_70;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                (&local_60,__l_00,(allocator_type *)((long)&payload_block + 3));
      IVar3 = spv::Builder::makeStructType
                        (&this->builder,&local_60,"InstrumentationControlDataSSBO");
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_60);
      local_44 = IVar3;
      spv::Builder::addMemberDecoration(&this->builder,IVar3,0,DecorationOffset,0);
      spv::Builder::addMemberName(&this->builder,local_44,0,"atomics");
      spv::Builder::addDecoration(&this->builder,local_44,DecorationBlock,-1);
      IVar3 = create_variable(this,StorageClassStorageBuffer,local_44,"InstrumentationControlData");
      (this->instruction_instrumentation).global_nan_inf_control_var_id = IVar3;
      spv::Builder::addDecoration
                (&this->builder,(this->instruction_instrumentation).global_nan_inf_control_var_id,
                 DecorationDescriptorSet,(this->instruction_instrumentation).info.control_desc_set);
      spv::Builder::addDecoration
                (&this->builder,(this->instruction_instrumentation).global_nan_inf_control_var_id,
                 DecorationBinding,(this->instruction_instrumentation).info.control_binding);
      local_7c = spv::Builder::makeRuntimeArray(&this->builder,control_data);
      spv::Builder::addDecoration(&this->builder,local_7c,DecorationArrayStride,0x10);
      call._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
      .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = local_7c;
      __l._M_len = 1;
      __l._M_array = (iterator)
                     ((long)&call._M_t.
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4);
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                (&local_98,__l,
                 (allocator_type *)
                 ((long)&call._M_t.
                         super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 3));
      IVar3 = spv::Builder::makeStructType(&this->builder,&local_98,"InstrumentationDataSSBO");
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_98);
      local_80 = IVar3;
      spv::Builder::addMemberName(&this->builder,IVar3,0,"data");
      spv::Builder::addMemberDecoration(&this->builder,local_80,0,DecorationOffset,0);
      spv::Builder::addDecoration(&this->builder,local_80,DecorationBlock,-1);
      IVar3 = create_variable(this,StorageClassStorageBuffer,local_80,"InstrumentationData");
      (this->instruction_instrumentation).global_nan_inf_data_var_id = IVar3;
      spv::Builder::addDecoration
                (&this->builder,(this->instruction_instrumentation).global_nan_inf_data_var_id,
                 DecorationDescriptorSet,(this->instruction_instrumentation).info.payload_desc_set);
      spv::Builder::addDecoration
                (&this->builder,(this->instruction_instrumentation).global_nan_inf_data_var_id,
                 DecorationBinding,(this->instruction_instrumentation).info.payload_binding);
    }
    if ((_u32_type != (Id *)0x0) && (*_u32_type == 0)) {
      if (bb_local._4_4_ == OpAssumeTrueKHR) {
        IVar3 = build_assume_true_call_function(this->self,&this->instruction_instrumentation);
        *_u32_type = IVar3;
      }
      else {
        IVar3 = build_nan_inf_instrument_call_function
                          (this->self,&this->instruction_instrumentation,uvec4_type);
        *_u32_type = IVar3;
      }
    }
    local_bc = spv::Builder::getUniqueId(&this->builder);
    local_c0 = spv::Builder::makeVoidType(&this->builder);
    local_c4 = 0x39;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_b8,&local_bc,&local_c0);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_b8);
    spv::Instruction::addIdOperand(pIVar4,*_u32_type);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_b8);
    spv::Instruction::addIdOperand(pIVar4,call_id._4_4_);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_b8);
    u = (this->instruction_instrumentation).instruction_count + 1;
    (this->instruction_instrumentation).instruction_count = u;
    IVar3 = spv::Builder::makeUintConstant(&this->builder,u,false);
    spv::Instruction::addIdOperand(pIVar4,IVar3);
    this_00 = pBStack_20;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_d0,&local_b8);
    spv::Block::addInstruction(this_00,&local_d0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_d0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_b8);
  }
  return;
}

Assistant:

void SPIRVModule::Impl::add_instrumented_instruction(spv::Op op, spv::Block *bb, spv::Id id)
{
	if (id == 0 || !instruction_instrumentation.info.enabled)
		return;

	spv::Id *call_id = nullptr;
	spv::Id type_id = 0;

	if (op == spv::OpAssumeTrueKHR)
	{
		call_id = &instruction_instrumentation.assume_true_call_id;
	}
	else
	{
		type_id = builder.getTypeId(id);
		if (builder.getTypeClass(type_id) != spv::OpTypeFloat)
			return;

		switch (builder.getScalarTypeWidth(type_id))
		{
		case 16:
			call_id = &instruction_instrumentation.nan_inf_instrument_fp16_call_id;
			break;

		case 32:
			call_id = &instruction_instrumentation.nan_inf_instrument_fp32_call_id;
			break;

		case 64:
			call_id = &instruction_instrumentation.nan_inf_instrument_fp64_call_id;
			break;

		default:
			break;
		}
	}

	if (!instruction_instrumentation.should_report_instrumentation_id)
	{
		instruction_instrumentation.should_report_instrumentation_id = create_variable_with_initializer(
			spv::StorageClassPrivate, builder.makeBoolType(),
			builder.makeBoolConstant(true), "ShouldReportInstrumentation");

		spv::Id u32_type = builder.makeUintType(32);
		spv::Id uvec4_type = builder.makeVectorType(u32_type, 4);
		spv::Id u32_array_type = builder.makeRuntimeArray(u32_type);
		builder.addDecoration(u32_array_type, spv::DecorationArrayStride, 4);
		spv::Id control_data = builder.makeStructType({ u32_array_type }, "InstrumentationControlDataSSBO");
		builder.addMemberDecoration(control_data, 0, spv::DecorationOffset, 0);
		builder.addMemberName(control_data, 0, "atomics");
		builder.addDecoration(control_data, spv::DecorationBlock);
		instruction_instrumentation.global_nan_inf_control_var_id =
			create_variable(spv::StorageClassStorageBuffer, control_data, "InstrumentationControlData");

		builder.addDecoration(instruction_instrumentation.global_nan_inf_control_var_id,
		                      spv::DecorationDescriptorSet, instruction_instrumentation.info.control_desc_set);

		builder.addDecoration(instruction_instrumentation.global_nan_inf_control_var_id,
		                      spv::DecorationBinding,
		                      instruction_instrumentation.info.control_binding);

		spv::Id payload_data_array = builder.makeRuntimeArray(uvec4_type);
		builder.addDecoration(payload_data_array, spv::DecorationArrayStride, 16);

		spv::Id payload_block = builder.makeStructType({ payload_data_array }, "InstrumentationDataSSBO");
		builder.addMemberName(payload_block, 0, "data");
		builder.addMemberDecoration(payload_block, 0, spv::DecorationOffset, 0);
		builder.addDecoration(payload_block, spv::DecorationBlock);
		instruction_instrumentation.global_nan_inf_data_var_id =
			create_variable(spv::StorageClassStorageBuffer, payload_block, "InstrumentationData");

		builder.addDecoration(instruction_instrumentation.global_nan_inf_data_var_id,
		                      spv::DecorationDescriptorSet, instruction_instrumentation.info.payload_desc_set);

		builder.addDecoration(instruction_instrumentation.global_nan_inf_data_var_id,
		                      spv::DecorationBinding,
		                      instruction_instrumentation.info.payload_binding);
	}

	if (call_id && !*call_id)
	{
		if (op == spv::OpAssumeTrueKHR)
			*call_id = build_assume_true_call_function(self, instruction_instrumentation);
		else
			*call_id = build_nan_inf_instrument_call_function(self, instruction_instrumentation, type_id);
	}

	auto call = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeVoidType(), spv::OpFunctionCall);
	call->addIdOperand(*call_id);
	call->addIdOperand(id);
	call->addIdOperand(builder.makeUintConstant(++instruction_instrumentation.instruction_count));
	bb->addInstruction(std::move(call));
}